

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O2

bool __thiscall
Clasp::DefaultUnfoundedCheck::MinimalityCheck::partialCheck(MinimalityCheck *this,uint32 level)

{
  uint32 uVar1;
  
  if (level < this->low) {
    uVar1 = (level - this->low) + this->next;
    this->next = uVar1;
    this->low = level;
  }
  else {
    uVar1 = this->next;
  }
  return uVar1 == level || uVar1 == 0;
}

Assistant:

bool DefaultUnfoundedCheck::MinimalityCheck::partialCheck(uint32 level) {
	if (level < low) {
		next -= (low - level);
		low   = level;
	}
	return !next || next == level;
}